

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_encoder.cpp
# Opt level: O0

void __thiscall zmq::v1_encoder_t::size_ready(v1_encoder_t *this)

{
  void *write_pos_;
  size_t to_write_;
  encoder_base_t<zmq::v1_encoder_t> *in_RDI;
  msg_t *in_stack_ffffffffffffffe8;
  
  encoder_base_t<zmq::v1_encoder_t>::in_progress(in_RDI);
  write_pos_ = msg_t::data(in_stack_ffffffffffffffe8);
  encoder_base_t<zmq::v1_encoder_t>::in_progress(in_RDI);
  to_write_ = msg_t::size(in_stack_ffffffffffffffe8);
  encoder_base_t<zmq::v1_encoder_t>::next_step(in_RDI,write_pos_,to_write_,0x31bb40,false);
  return;
}

Assistant:

void zmq::v1_encoder_t::size_ready ()
{
    //  Write message body into the buffer.
    next_step (in_progress ()->data (), in_progress ()->size (),
               &v1_encoder_t::message_ready, true);
}